

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::syntactic::VolumeIntegrator::~VolumeIntegrator(VolumeIntegrator *this)

{
  Node::~Node(&this->super_Node);
  return;
}

Assistant:

struct PBRT_PARSER_INTERFACE VolumeIntegrator : public Node {

      /*! a "Type::SP" shorthand for std::shared_ptr<Type> - makes code
        more concise, and easier to read */
      typedef std::shared_ptr<VolumeIntegrator> SP;
    
      /*! constructor */
      VolumeIntegrator(const std::string &type) : Node(type) {};
    
      /*! pretty-printing, for debugging */
      virtual std::string toString() const override { return "VolumeIntegrator<"+type+">"; }
    }